

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void sep_downsample(j_compress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_index,
                   JSAMPIMAGE output_buf,JDIMENSION out_row_group_index)

{
  jpeg_downsampler *pjVar1;
  JSAMPARRAY out_ptr;
  JSAMPARRAY in_ptr;
  jpeg_component_info *compptr;
  int ci;
  my_downsample_ptr downsample;
  JDIMENSION out_row_group_index_local;
  JSAMPIMAGE output_buf_local;
  JDIMENSION in_row_index_local;
  JSAMPIMAGE input_buf_local;
  j_compress_ptr cinfo_local;
  
  pjVar1 = cinfo->downsample;
  for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->num_components; compptr._4_4_ = compptr._4_4_ + 1)
  {
    (*(&pjVar1[1].start_pass)[compptr._4_4_])(cinfo);
  }
  return;
}

Assistant:

METHODDEF(void)
sep_downsample (j_compress_ptr cinfo,
		JSAMPIMAGE input_buf, JDIMENSION in_row_index,
		JSAMPIMAGE output_buf, JDIMENSION out_row_group_index)
{
  my_downsample_ptr downsample = (my_downsample_ptr) cinfo->downsample;
  int ci;
  jpeg_component_info * compptr;
  JSAMPARRAY in_ptr, out_ptr;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    in_ptr = input_buf[ci] + in_row_index;
    out_ptr = output_buf[ci] +
	      (out_row_group_index * downsample->rowgroup_height[ci]);
    (*downsample->methods[ci]) (cinfo, compptr, in_ptr, out_ptr);
  }
}